

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O0

EStatusCode __thiscall
ShadingWriter::WriteSweepShadingPatternObject
          (ShadingWriter *this,double inCX,double inCY,double inStartAngleRad,double inEndAngleRad,
          InterpretedGradientStopList *inColorLine,FT_PaintExtend inGradientExtend,
          PDFRectangle *inBounds,PDFMatrix *inMatrix,ObjectIDType inPatternObjectId)

{
  bool bVar1;
  undefined1 local_a0 [8];
  SweepShading sweepParams;
  ObjectIDType inPatternObjectId_local;
  PDFMatrix *inMatrix_local;
  PDFRectangle *inBounds_local;
  FT_PaintExtend inGradientExtend_local;
  InterpretedGradientStopList *inColorLine_local;
  double inEndAngleRad_local;
  double inStartAngleRad_local;
  double inCY_local;
  double inCX_local;
  ShadingWriter *this_local;
  
  local_a0 = (undefined1  [8])inCX;
  sweepParams.cX = inCY;
  sweepParams.cY = inStartAngleRad;
  sweepParams.startAngleRad = inEndAngleRad;
  sweepParams._56_8_ = inPatternObjectId;
  std::__cxx11::list<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>::list
            ((list<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_> *)
             &sweepParams.endAngleRad,inColorLine);
  sweepParams.colorLine.
  super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>._M_impl.
  _M_node._M_size._0_4_ = inGradientExtend;
  bVar1 = ColorLineHasTransparency(this,inColorLine);
  if (bVar1) {
    this_local._4_4_ =
         WriteRGBATiledPatternObject
                   (this,(SweepShading *)local_a0,inBounds,inMatrix,sweepParams._56_8_);
  }
  else {
    this_local._4_4_ =
         WriteRGBShadingPatternObject
                   (this,(SweepShading *)local_a0,inBounds,inMatrix,sweepParams._56_8_);
  }
  SweepShading::~SweepShading((SweepShading *)local_a0);
  return this_local._4_4_;
}

Assistant:

EStatusCode ShadingWriter::WriteSweepShadingPatternObject(
    double inCX,
    double inCY,
    double inStartAngleRad,
    double inEndAngleRad,
    const InterpretedGradientStopList& inColorLine,
    FT_PaintExtend inGradientExtend,
    const PDFRectangle& inBounds,
    const PDFMatrix& inMatrix,
    ObjectIDType inPatternObjectId) {

    // Note: at this point start and end angles are ignored. 0..360 is the range used at all times.
    // As a side effect this also means there's no support for extend, as the full range is always implemented.
    SweepShading sweepParams = {
        inCX,
        inCY,
        inStartAngleRad,
        inEndAngleRad,
        inColorLine,
        inGradientExtend
    };

    if(ColorLineHasTransparency(inColorLine))
        return WriteRGBATiledPatternObject(sweepParams, inBounds, inMatrix, inPatternObjectId);
    else
        return WriteRGBShadingPatternObject(sweepParams, inBounds, inMatrix, inPatternObjectId);

}